

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# public_util.h
# Opt level: O1

type * dukglue_pcall_method<DukValue,DukValue>
                 (type *__return_storage_ptr__,duk_context *ctx,DukValue *obj,char *method_name)

{
  duk_int_t return_code;
  DukErrorException *this;
  DukValue out;
  SafeMethodCallData<DukValue,_DukValue> data;
  undefined1 local_88 [32];
  _Alloc_hider local_68;
  size_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  int *local_48;
  DukValue *local_40;
  char *local_38;
  undefined1 *local_28;
  
  local_28 = local_88;
  local_68._M_p = (pointer)&local_58;
  local_88._0_8_ = &PTR__DukValue_0016b688;
  local_88._8_8_ = (duk_context *)0x0;
  local_88[0x10] = UNDEFINED;
  local_60 = 0;
  local_58._M_local_buf[0] = '\0';
  local_48 = (int *)0x0;
  local_40 = obj;
  local_38 = method_name;
  return_code = duk_safe_call(ctx,dukglue::detail::call_method_safe<DukValue,DukValue>,&local_40,0,1
                             );
  if (return_code == 0) {
    duk_pop(ctx);
    __return_storage_ptr__->_vptr_DukValue = (_func_int **)&PTR__DukValue_0016b688;
    (__return_storage_ptr__->mString)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->mString).field_2;
    (__return_storage_ptr__->mString)._M_string_length = 0;
    (__return_storage_ptr__->mString).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->mContext = (duk_context *)local_88._8_8_;
    __return_storage_ptr__->mType = local_88[0x10];
    __return_storage_ptr__->mPOD = (ValueTypes)local_88._24_8_;
    __return_storage_ptr__->mRefCount = local_48;
    if (local_88[0x10] == STRING) {
      std::__cxx11::string::operator=
                ((string *)&__return_storage_ptr__->mString,(string *)&local_68);
    }
    local_88[0x10] = UNDEFINED;
    local_48 = (int *)0x0;
    DukValue::~DukValue((DukValue *)local_88);
    return __return_storage_ptr__;
  }
  this = (DukErrorException *)__cxa_allocate_exception(0x28);
  DukErrorException::DukErrorException(this,ctx,return_code,true);
  __cxa_throw(this,&DukErrorException::typeinfo,DukException::~DukException);
}

Assistant:

typename std::enable_if<!std::is_void<RetT>::value, RetT>::type dukglue_pcall_method(duk_context* ctx, const ObjT& obj, const char* method_name, ArgTs... args)
{
	RetT out;
	dukglue::detail::SafeMethodCallData<RetT, ObjT, ArgTs...> data {
		&obj, method_name, std::tuple<ArgTs...>(args...), &out
	};

	duk_idx_t rc = duk_safe_call(ctx, &dukglue::detail::call_method_safe<RetT, ObjT, ArgTs...>, (void*) &data, 0, 1);
	if (rc != 0)
		throw DukErrorException(ctx, rc);

	duk_pop(ctx);  // remove result from stack
	return std::move(out);
}